

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yang.c
# Opt level: O0

void yprp_identity(lys_ypr_ctx_conflict *pctx,lysp_ident *ident)

{
  char *local_38;
  char *local_28;
  uint64_t u;
  lysp_ident *plStack_18;
  int8_t flag;
  lysp_ident *ident_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  u._7_1_ = '\0';
  plStack_18 = ident;
  ident_local = (lysp_ident *)pctx;
  ypr_open(pctx,"identity","name",ident->name,'\0');
  *(short *)&ident_local->iffeatures = *(short *)&ident_local->iffeatures + 1;
  yprp_extension_instances
            ((lys_ypr_ctx_conflict *)ident_local,LY_STMT_IDENTITY,'\0',plStack_18->exts,
             (int8_t *)((long)&u + 7));
  yprp_iffeatures((lys_ypr_ctx_conflict *)ident_local,plStack_18->iffeatures,plStack_18->exts,
                  (int8_t *)((long)&u + 7));
  local_28 = (char *)0x0;
  while( true ) {
    if (plStack_18->bases == (char **)0x0) {
      local_38 = (char *)0x0;
    }
    else {
      local_38 = plStack_18->bases[-1];
    }
    if (local_38 <= local_28) break;
    ypr_close_parent((lys_ypr_ctx_conflict *)ident_local,(int8_t *)((long)&u + 7));
    ypr_substmt((lys_ypr_ctx_conflict *)ident_local,LY_STMT_BASE,(uint8_t)local_28,
                plStack_18->bases[(long)local_28],plStack_18->exts);
    local_28 = local_28 + 1;
  }
  ypr_status((lys_ypr_ctx_conflict *)ident_local,plStack_18->flags,plStack_18->exts,
             (int8_t *)((long)&u + 7));
  ypr_description((lys_ypr_ctx_conflict *)ident_local,plStack_18->dsc,plStack_18->exts,
                  (int8_t *)((long)&u + 7));
  ypr_reference((lys_ypr_ctx_conflict *)ident_local,plStack_18->ref,plStack_18->exts,
                (int8_t *)((long)&u + 7));
  *(short *)&ident_local->iffeatures = *(short *)&ident_local->iffeatures + -1;
  ypr_close((lys_ypr_ctx_conflict *)ident_local,"identity",u._7_1_);
  return;
}

Assistant:

static void
yprp_identity(struct lys_ypr_ctx *pctx, const struct lysp_ident *ident)
{
    ly_bool flag = 0;
    LY_ARRAY_COUNT_TYPE u;

    ly_print_(pctx->out, "%*sidentity %s", INDENT, ident->name);
    LEVEL++;

    yprp_extension_instances(pctx, LY_STMT_IDENTITY, 0, ident->exts, &flag);
    yprp_iffeatures(pctx, ident->iffeatures, ident->exts, &flag);

    LY_ARRAY_FOR(ident->bases, u) {
        ypr_open(pctx->out, &flag);
        ypr_substmt(pctx, LY_STMT_BASE, u, ident->bases[u], 0, ident->exts);
    }

    ypr_status(pctx, ident->flags, ident->exts, &flag);
    ypr_description(pctx, ident->dsc, ident->exts, &flag);
    ypr_reference(pctx, ident->ref, ident->exts, &flag);

    LEVEL--;
    ypr_close(pctx, flag);
}